

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBCellFlag.cpp
# Opt level: O2

NumCells *
amrex::anon_unknown_27::countCells
          (NumCells *__return_storage_ptr__,Array4<const_amrex::EBCellFlag> *flag,Box *bx)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  Long LVar5;
  EBCellFlag *pEVar6;
  long lVar7;
  EBCellFlag *pEVar8;
  int iVar9;
  long lVar10;
  FabType FVar11;
  long lVar12;
  long lVar13;
  EBCellFlag *pEVar14;
  long lVar15;
  int *piVar16;
  int nmulti;
  int nsingle;
  int nregular;
  NumCells *local_58;
  
  nregular = 0;
  nsingle = 0;
  nmulti = 0;
  local_58 = __return_storage_ptr__;
  LVar5 = Box::numPts(bx);
  lVar3 = flag->jstride;
  lVar4 = flag->kstride;
  lVar7 = (long)(bx->smallend).vect[0];
  lVar13 = (long)(bx->smallend).vect[1];
  lVar15 = (long)(bx->smallend).vect[2];
  iVar9 = (bx->bigend).vect[0];
  iVar1 = (bx->bigend).vect[1];
  pEVar6 = flag->p + ((lVar7 + (lVar13 - (flag->begin).y) * lVar3 +
                               (lVar15 - (flag->begin).z) * lVar4) - (long)(flag->begin).x);
  iVar2 = (bx->bigend).vect[2];
  do {
    pEVar8 = pEVar6;
    lVar12 = lVar13;
    if (iVar2 < lVar15) {
      iVar9 = nsingle + nregular + nmulti;
      FVar11 = regular;
      if (nregular != (int)LVar5) {
        if (iVar9 == 0) {
          FVar11 = covered;
        }
        else {
          FVar11 = (uint)(0 < nmulti) + singlevalued;
        }
      }
      local_58->type = FVar11;
      local_58->nregular = nregular;
      local_58->nsingle = nsingle;
      local_58->nmulti = nmulti;
      local_58->ncovered = (int)LVar5 - iVar9;
      return local_58;
    }
    for (; lVar10 = lVar7, pEVar14 = pEVar8, lVar12 <= iVar1; lVar12 = lVar12 + 1) {
      for (; lVar10 <= iVar9; lVar10 = lVar10 + 1) {
        piVar16 = &nregular;
        switch(pEVar14->flag & 3) {
        case 1:
          piVar16 = &nsingle;
          break;
        case 2:
          piVar16 = &nmulti;
          break;
        case 3:
          goto switchD_00595de8_caseD_3;
        }
        *piVar16 = *piVar16 + 1;
switchD_00595de8_caseD_3:
        pEVar14 = pEVar14 + 1;
      }
      pEVar8 = pEVar8 + lVar3;
    }
    lVar15 = lVar15 + 1;
    pEVar6 = pEVar6 + lVar4;
  } while( true );
}

Assistant:

EBCellFlagFab::NumCells countCells (Array4<EBCellFlag const> const& flag, const Box& bx) noexcept
{
    int nregular=0, nsingle=0, nmulti=0;
    int ncells = static_cast<int>(bx.numPts());
    AMREX_ASSERT(bx.numPts() <= static_cast<Long>(std::numeric_limits<int>::max()));

    if (Gpu::inLaunchRegion())
    {
        ReduceOps<ReduceOpSum,ReduceOpSum,ReduceOpSum> reduce_op;
        ReduceData<int,int,int> reduce_data(reduce_op);
        using ReduceTuple = typename decltype(reduce_data)::Type;
        reduce_op.eval(bx, reduce_data,
        [=] AMREX_GPU_DEVICE (int i, int j, int k) -> ReduceTuple
        {
            int nr=0, ns=0, nm=0;
            auto f = flag(i,j,k);
            if (f.isRegular()) {
                ++nr;
            } else if (f.isSingleValued()) {
                ++ns;
            } else if (f.isMultiValued()) {
                ++nm;
            }
            return {nr, ns, nm};
        });
        ReduceTuple hv = reduce_data.value(reduce_op);
        nregular = amrex::get<0>(hv);
        nsingle  = amrex::get<1>(hv);
        nmulti   = amrex::get<2>(hv);
    }
    else
    {
        amrex::LoopOnCpu(bx,
        [=,&nregular,&nsingle,&nmulti] (int i, int j, int k) noexcept
        {
            auto f = flag(i,j,k);
            if (f.isRegular()) {
                ++nregular;
            } else if (f.isSingleValued()) {
                ++nsingle;
            } else if (f.isMultiValued()) {
                ++nmulti;
            }
        });
    }

    int ncovered = ncells - nregular - nsingle - nmulti;

    EBCellFlagFab::NumCells r;
    if (nregular == ncells) {
        r.type = FabType::regular;
    } else if (ncovered == ncells) {
        r.type = FabType::covered;
    } else if (nmulti > 0) {
        r.type = FabType::multivalued;
    } else {
        r.type = FabType::singlevalued;
    }
    r.nregular = nregular;
    r.nsingle = nsingle;
    r.nmulti = nmulti;
    r.ncovered = ncovered;
    return r;
}